

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu_Impl.cpp
# Opt level: O0

void __thiscall Vgm_Emu_Impl::write_pcm(Vgm_Emu_Impl *this,vgm_time_t vgm_time,int amp)

{
  int iVar1;
  int in_EDX;
  vgm_time_t in_ESI;
  Vgm_Emu_Impl *in_RDI;
  int delta;
  int old;
  blip_time_t blip_time;
  undefined4 in_stack_ffffffffffffffe0;
  
  to_blip_time(in_RDI,in_ESI);
  iVar1 = in_RDI->dac_amp;
  in_RDI->dac_amp = in_EDX;
  if (iVar1 < 0) {
    in_RDI->dac_amp = in_RDI->dac_disabled | in_RDI->dac_amp;
  }
  else {
    Blip_Synth<8,_1>::offset_inline
              ((Blip_Synth<8,_1> *)CONCAT44(in_EDX - iVar1,in_stack_ffffffffffffffe0),
               (blip_time_t)((ulong)in_RDI >> 0x20),(int)in_RDI,(Blip_Buffer *)0x80c796);
  }
  return;
}

Assistant:

void Vgm_Emu_Impl::write_pcm( vgm_time_t vgm_time, int amp )
{
	blip_time_t blip_time = to_blip_time( vgm_time );
	int old = dac_amp;
	int delta = amp - old;
	dac_amp = amp;
	if ( old >= 0 )
		dac_synth.offset_inline( blip_time, delta, &blip_buf );
	else
		dac_amp |= dac_disabled;
}